

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O1

ConstantMultiFieldModifier * __thiscall
icu_63::number::impl::MutablePatternModifier::createConstantModifier
          (MutablePatternModifier *this,UErrorCode *status)

{
  int iVar1;
  CurrencySpacingEnabledModifier *this_00;
  NumberStringBuilder *sb;
  NumberStringBuilder b;
  NumberStringBuilder a;
  NumberStringBuilder local_218;
  NumberStringBuilder local_118;
  
  NumberStringBuilder::NumberStringBuilder(&local_118);
  NumberStringBuilder::NumberStringBuilder(&local_218);
  insertPrefix(this,&local_118,0,status);
  sb = &local_218;
  insertSuffix(this,sb,0,status);
  iVar1 = (*this->fPatternInfo->_vptr_AffixPatternProvider[5])();
  if ((char)iVar1 == '\0') {
    this_00 = (CurrencySpacingEnabledModifier *)UMemory::operator_new((UMemory *)0x220,(size_t)sb);
    if (this_00 != (CurrencySpacingEnabledModifier *)0x0) {
      iVar1 = (*this->fPatternInfo->_vptr_AffixPatternProvider[10])();
      ConstantMultiFieldModifier::ConstantMultiFieldModifier
                ((ConstantMultiFieldModifier *)this_00,&local_118,&local_218,(bool)((byte)iVar1 ^ 1)
                 ,this->fStrong);
      goto LAB_002aa656;
    }
  }
  else {
    this_00 = (CurrencySpacingEnabledModifier *)UMemory::operator_new((UMemory *)0x350,(size_t)sb);
    if (this_00 != (CurrencySpacingEnabledModifier *)0x0) {
      iVar1 = (*this->fPatternInfo->_vptr_AffixPatternProvider[10])();
      CurrencySpacingEnabledModifier::CurrencySpacingEnabledModifier
                (this_00,&local_118,&local_218,(bool)((byte)iVar1 ^ 1),this->fStrong,this->fSymbols,
                 status);
      goto LAB_002aa656;
    }
  }
  this_00 = (CurrencySpacingEnabledModifier *)0x0;
LAB_002aa656:
  NumberStringBuilder::~NumberStringBuilder(&local_218);
  NumberStringBuilder::~NumberStringBuilder(&local_118);
  return &this_00->super_ConstantMultiFieldModifier;
}

Assistant:

ConstantMultiFieldModifier* MutablePatternModifier::createConstantModifier(UErrorCode& status) {
    NumberStringBuilder a;
    NumberStringBuilder b;
    insertPrefix(a, 0, status);
    insertSuffix(b, 0, status);
    if (fPatternInfo->hasCurrencySign()) {
        return new CurrencySpacingEnabledModifier(
                a, b, !fPatternInfo->hasBody(), fStrong, *fSymbols, status);
    } else {
        return new ConstantMultiFieldModifier(a, b, !fPatternInfo->hasBody(), fStrong);
    }
}